

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiSphereShape.cpp
# Opt level: O2

void __thiscall
btMultiSphereShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (btMultiSphereShape *this,btVector3 *vectors,btVector3 *supportVerticesOut,int numVectors)

{
  btVector3 *this_00;
  btVector3 *v1;
  float fVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  btScalar bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  float *pfVar10;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  btScalar in_XMM1_Dc;
  btScalar in_XMM1_Dd;
  btVector3 bVar11;
  btScalar newDot;
  btVector3 temp [128];
  float local_8bc;
  btScalar local_8a8;
  float local_8a4;
  btVector3 *local_8a0;
  btVector3 *local_898;
  btVector3 *local_890;
  ulong local_888;
  ulong local_880;
  btVector3 *local_878;
  btVector3 *local_870;
  undefined1 local_868 [16];
  undefined1 local_858 [16];
  btVector3 local_848;
  btVector3 local_838 [128];
  
  local_888 = (ulong)(uint)numVectors;
  if (numVectors < 1) {
    local_888 = 0;
  }
  local_870 = (btVector3 *)
              &(this->super_btConvexInternalAabbCachingShape).super_btConvexInternalShape.
               super_btConvexShape.super_btCollisionShape.field_0x1c;
  local_898 = vectors;
  local_890 = supportVerticesOut;
  for (local_880 = 0; local_880 != local_888; local_880 = local_880 + 1) {
    this_00 = local_898 + local_880;
    pfVar10 = (this->m_radiArray).m_data;
    uVar2 = (this->m_localPositionArray).m_size;
    local_878 = local_890 + local_880;
    iVar6 = 0;
    local_8bc = -1e+18;
    uVar8 = uVar2;
    local_8a0 = (this->m_localPositionArray).m_data;
    while( true ) {
      uVar9 = 0x80;
      if ((int)uVar8 < 0x80) {
        uVar9 = uVar8;
      }
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      iVar5 = uVar2 - iVar6;
      if (iVar5 == 0 || (int)uVar2 < iVar6) break;
      if (0x7f < iVar5) {
        iVar5 = 0x80;
      }
      for (lVar7 = 0; v1 = (btVector3 *)((long)local_8a0->m_floats + lVar7),
          (ulong)uVar9 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
        bVar11 = operator*(this_00,local_870);
        fVar1 = *pfVar10;
        local_848.m_floats[1] = fVar1 * bVar11.m_floats[1];
        local_848.m_floats[0] = fVar1 * bVar11.m_floats[0];
        local_848.m_floats[2] = bVar11.m_floats[2] * fVar1;
        local_848.m_floats[3] = 0.0;
        bVar11 = operator+(v1,&local_848);
        local_868._8_4_ = extraout_XMM0_Dc;
        local_868._0_8_ = bVar11.m_floats._0_8_;
        local_868._12_4_ = extraout_XMM0_Dd;
        local_858._8_4_ = in_XMM1_Dc;
        local_858._0_8_ = bVar11.m_floats._8_8_;
        local_858._12_4_ = in_XMM1_Dd;
        (*(this->super_btConvexInternalAabbCachingShape).super_btConvexInternalShape.
          super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
        bVar11 = operator*(this_00,&local_8a8);
        auVar3._4_4_ = (float)local_868._4_4_ - bVar11.m_floats[1];
        auVar3._0_4_ = (float)local_868._0_4_ - bVar11.m_floats[0];
        auVar3._8_4_ = (float)local_858._0_4_ - bVar11.m_floats[2];
        auVar3._12_4_ = 0;
        *(undefined1 (*) [16])((long)local_838[0].m_floats + lVar7) = auVar3;
        pfVar10 = pfVar10 + 1;
      }
      lVar7 = btVector3::maxDot(this_00,local_838,(long)iVar5,&local_8a4);
      if (local_8bc < local_8a4) {
        bVar4 = local_838[lVar7].m_floats[1];
        in_XMM1_Dc = local_838[lVar7].m_floats[2];
        in_XMM1_Dd = local_838[lVar7].m_floats[3];
        local_878->m_floats[0] = local_838[lVar7].m_floats[0];
        local_878->m_floats[1] = bVar4;
        local_878->m_floats[2] = in_XMM1_Dc;
        local_878->m_floats[3] = in_XMM1_Dd;
        local_8bc = local_8a4;
      }
      iVar6 = iVar6 + 0x80;
      uVar8 = uVar8 - 0x80;
      local_8a0 = v1;
    }
  }
  return;
}

Assistant:

void	btMultiSphereShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const btVector3* vectors,btVector3* supportVerticesOut,int numVectors) const
{

	for (int j=0;j<numVectors;j++)
	{
		btScalar maxDot(btScalar(-BT_LARGE_FLOAT));

		const btVector3& vec = vectors[j];

		btVector3 vtx;
		btScalar newDot;

		const btVector3* pos = &m_localPositionArray[0];
		const btScalar* rad = &m_radiArray[0];
		int numSpheres = m_localPositionArray.size();

        for( int k = 0; k < numSpheres; k+= 128 )
        {
            btVector3 temp[128];
            int inner_count = MIN( numSpheres - k, 128 );
            for( long i = 0; i < inner_count; i++ )
            {
                temp[i] = (*pos) +vec*m_localScaling*(*rad) - vec * getMargin();
                pos++;
                rad++;
            }
            long i = vec.maxDot( temp, inner_count, newDot);
            if( newDot > maxDot )
            {
                maxDot = newDot;
                supportVerticesOut[j] = temp[i];
            }
        }
        
	}
}